

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  XMLError error_00;
  ostream *poVar2;
  char *filename_00;
  exception *e;
  VideoHppGenerator generator;
  undefined1 local_360 [4];
  XMLError error;
  XMLDocument doc;
  int local_50;
  int i;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  filename.field_2._8_8_ = argv;
  if (argc % 2 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "VideoHppGenerator usage: VideoHppGenerator [-f filename]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"\tdefault for filename is <");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/video.xml"
                            );
    poVar2 = std::operator<<(poVar2,">");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/video.xml"
               ,&local_39);
    std::allocator<char>::~allocator(&local_39);
    for (local_50 = 1; local_50 < argc; local_50 = local_50 + 2) {
      iVar1 = strcmp(*(char **)(filename.field_2._8_8_ + (long)local_50 * 8),"-f");
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"unsupported argument <");
        poVar2 = std::operator<<(poVar2,*(char **)(filename.field_2._8_8_ + (long)local_50 * 8));
        poVar2 = std::operator<<(poVar2,">");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = -1;
        doc._commentPool._nUntracked = 1;
        goto LAB_0011b663;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 *(char **)(filename.field_2._8_8_ + 8 + (long)local_50 * 8));
    }
    tinyxml2::XMLDocument::XMLDocument((XMLDocument *)local_360,true,PRESERVE_WHITESPACE);
    poVar2 = std::operator<<((ostream *)&std::cout,"VideoHppGenerator: Loading ");
    poVar2 = std::operator<<(poVar2,(string *)local_38);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    filename_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
    error_00 = tinyxml2::XMLDocument::LoadFile((XMLDocument *)local_360,filename_00);
    if (error_00 == XML_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&std::cout,"VideoHppGenerator: Parsing ");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      VideoHppGenerator::VideoHppGenerator((VideoHppGenerator *)&e,(XMLDocument *)local_360);
      VideoHppGenerator::generateHppFile((VideoHppGenerator *)&e);
      std::operator<<((ostream *)&std::cout,
                      "VideoHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n"
                     );
      VideoHppGenerator::~VideoHppGenerator((VideoHppGenerator *)&e);
      argv_local._4_4_ = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"VideoHppGenerator: failed to load file ");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      poVar2 = std::operator<<(poVar2," with error <");
      toString_abi_cxx11_((string *)
                          &generator.m_types._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          error_00);
      poVar2 = std::operator<<(poVar2,(string *)
                                      &generator.m_types._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
      poVar2 = std::operator<<(poVar2,">");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string
                ((string *)&generator.m_types._M_t._M_impl.super__Rb_tree_header._M_node_count);
      argv_local._4_4_ = -1;
    }
    doc._commentPool._nUntracked = 1;
    tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)local_360);
LAB_0011b663:
    std::__cxx11::string::~string((string *)local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char ** argv )
{
  if ( ( argc % 2 ) == 0 )
  {
    std::cout << "VideoHppGenerator usage: VideoHppGenerator [-f filename]" << std::endl;
    std::cout << "\tdefault for filename is <" << VIDEO_SPEC << ">" << std::endl;
    return -1;
  }

  std::string filename = VIDEO_SPEC;
  for ( int i = 1; i < argc; i += 2 )
  {
    if ( strcmp( argv[i], "-f" ) == 0 )
    {
      filename = argv[i + 1];
    }
    else
    {
      std::cout << "unsupported argument <" << argv[i] << ">" << std::endl;
      return -1;
    }
  }

#if defined( CLANG_FORMAT_EXECUTABLE )
  std::cout << "VideoHppGenerator: Found ";
  std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" --version ";
  int         ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    std::cout << "VideoHppGenerator: failed to determine clang_format version with error <" << ret << ">\n";
  }
#endif

  tinyxml2::XMLDocument doc;
  std::cout << "VideoHppGenerator: Loading " << filename << std::endl;
  tinyxml2::XMLError error = doc.LoadFile( filename.c_str() );
  if ( error != tinyxml2::XML_SUCCESS )
  {
    std::cout << "VideoHppGenerator: failed to load file " << filename << " with error <" << toString( error ) << ">" << std::endl;
    return -1;
  }

  try
  {
    std::cout << "VideoHppGenerator: Parsing " << filename << std::endl;
    VideoHppGenerator generator( doc );

    generator.generateHppFile();

#if !defined( CLANG_FORMAT_EXECUTABLE )
    std::cout << "VideoHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n";
#endif
  }
  catch ( std::exception const & e )
  {
    std::cout << "caught exception: " << e.what() << std::endl;
    return -1;
  }
  catch ( ... )
  {
    std::cout << "caught unknown exception" << std::endl;
    return -1;
  }
  return 0;
}